

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O2

void bsp_get_boundaries(void *handle,float *boundaries)

{
  float fVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  float *pfVar5;
  ulong uVar6;
  float *pfVar7;
  
  uVar3 = array_count((void *)**handle);
  if (0 < (int)uVar3) {
    bVar2 = *(byte *)((long)handle + 8);
    for (uVar4 = 0; bVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar1 = **(float **)(*handle + uVar4 * 8);
      boundaries[uVar4 * 2] = fVar1;
      boundaries[uVar4 * 2 + 1] = fVar1;
    }
    for (uVar4 = 0; uVar4 != bVar2; uVar4 = uVar4 + 1) {
      pfVar5 = boundaries + uVar4 * 2 + 1;
      for (uVar6 = 1; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        fVar1 = *(float *)(*(long *)(*handle + uVar4 * 8) + uVar6 * 4);
        pfVar7 = boundaries + uVar4 * 2;
        if ((fVar1 < boundaries[uVar4 * 2]) ||
           (pfVar7 = pfVar5, *pfVar5 <= fVar1 && fVar1 != *pfVar5)) {
          *pfVar7 = fVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void
bsp_get_boundaries(
    void * handle,
    float * boundaries )
{
    bsp_tree * tree;
    int i, j, cnt;
    tree = (bsp_tree *) handle;
    assert( tree != NULL );
    assert( tree->pointarrays != NULL );
    assert( tree->pointarrays[0] != NULL );
    if ( (cnt = array_count( tree->pointarrays[0] )) > 0 ) {
        for ( j = 0; j < tree->dimensions; j++ ) {
            boundaries[j*2] = tree->pointarrays[j][0];
            boundaries[j*2+1] = tree->pointarrays[j][0];
        }
        for ( j = 0; j < tree->dimensions; j++ ) {
            int min, max;
            min = j*2;
            max = j*2+1;
            for ( i = 1; i < cnt; i++ ) {
                /* MIN() */
                if ( boundaries[min] > tree->pointarrays[j][i] )
                    boundaries[min] = tree->pointarrays[j][i];
                /* MAX() */
                else if ( boundaries[max] < tree->pointarrays[j][i] )
                    boundaries[max] = tree->pointarrays[j][i];
            }
        }
    }
}